

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_memory.cpp
# Opt level: O1

ObjInfo * __thiscall GCHeap::find(GCHeap *this,void *ptr)

{
  ObjInfo *pOVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  pOVar1 = (ObjInfo *)(this->mObjects).mList.mHead.mNext;
  if (pOVar1 != (ObjInfo *)0x0 && pOVar1 != (ObjInfo *)&(this->mObjects).mList.mTail) {
    do {
      if ((pOVar1->ptr <= ptr) && (ptr < (void *)((long)pOVar1->ptr + (ulong)pOVar1->size)))
      goto LAB_00122f2f;
      pOVar1 = (ObjInfo *)(pOVar1->super_Node).mNext;
      if ((pOVar1->super_Node).mNext == (Node *)0x0) {
        pOVar1 = (ObjInfo *)0x0;
      }
    } while (pOVar1 != (ObjInfo *)0x0);
  }
  pOVar1 = (ObjInfo *)0x0;
LAB_00122f2f:
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  return pOVar1;
}

Assistant:

GCHeap::ObjInfo *GCHeap::find( void *ptr )
{
	Mutex::EnterCriticalSection();
	ObjInfo *obj = mObjects.getHead();
	while ( obj != NULL )
	{
		if ( ptr >= obj->ptr && (uint8_t*)ptr < (uint8_t*)obj->ptr + obj->size )
		{
			Mutex::ExitCriticalSection();
			return obj;
		}

		obj = mObjects.next( obj );
	}

	Mutex::ExitCriticalSection();

	return NULL;
}